

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void __thiscall ParserTest_ParsesIntegers_Test::TestBody(ParserTest_ParsesIntegers_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_578;
  Message local_570;
  int local_564;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_530;
  Message local_528;
  allocator local_519;
  string local_518;
  bool local_4f1;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_4c0;
  Message local_4b8;
  allocator local_4a9;
  string local_4a8;
  bool local_481;
  undefined1 local_480 [8];
  AssertionResult gtest_ar__7;
  Message local_468;
  int local_45c;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_428;
  Message local_420;
  allocator local_411;
  string local_410;
  bool local_3e9;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar__6;
  Message local_3d0;
  int local_3c4;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_390;
  Message local_388;
  allocator local_379;
  string local_378;
  bool local_351;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__5;
  Message local_338;
  int local_32c;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_2f8;
  Message local_2f0;
  allocator local_2e1;
  string local_2e0;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__4;
  Message local_2a0;
  int local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_260;
  Message local_258;
  allocator local_249;
  string local_248;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__3;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1c8;
  Message local_1c0;
  allocator local_1b1;
  string local_1b0;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__2;
  Message local_170;
  int local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_130;
  Message local_128;
  allocator local_119;
  string local_118;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__1;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  string local_b0;
  AssertHelper local_90;
  Message local_88 [3];
  allocator local_69;
  string local_68;
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  int64_t v64;
  P parser;
  ParserTest_ParsesIntegers_Test *this_local;
  
  parser.parser.tracer = (CcsTracer *)this;
  anon_unknown.dwarf_38f65::P::P((P *)&v64);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"value = 100",&local_69);
  local_41 = anon_unknown.dwarf_38f65::P::parseInt
                       ((P *)&v64,&local_68,(int64_t *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_40,&local_41,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_40,
               (AssertionResult *)"parser.parseInt(\"value = 100\", v64)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(local_88);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_cc = 100;
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              ((EqHelper *)local_c8,"100","v64",&local_cc,(long *)&gtest_ar_.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                 ,0x9c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,"value = 0",&local_119);
    local_f1 = anon_unknown.dwarf_38f65::P::parseInt
                         ((P *)&v64,&local_118,(int64_t *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_f0,&local_f1,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_f0,
                 (AssertionResult *)"parser.parseInt(\"value = 0\", v64)","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                 ,0x9d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_130,&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_128);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_164 = 0;
      testing::internal::EqHelper::Compare<int,_long,_nullptr>
                ((EqHelper *)local_160,"0","v64",&local_164,(long *)&gtest_ar_.message_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
      if (!bVar1) {
        testing::Message::Message(&local_170);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                   ,0x9e,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_170)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_170);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b0,"value = -0",&local_1b1);
      local_189 = anon_unknown.dwarf_38f65::P::parseInt
                            ((P *)&v64,&local_1b0,(int64_t *)&gtest_ar_.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_188,&local_189,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar1) {
        testing::Message::Message(&local_1c0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_188,
                   (AssertionResult *)"parser.parseInt(\"value = -0\", v64)","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                   ,0x9f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1c0);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_1fc = 0;
        testing::internal::EqHelper::Compare<int,_long,_nullptr>
                  ((EqHelper *)local_1f8,"0","v64",&local_1fc,(long *)&gtest_ar_.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
        if (!bVar1) {
          testing::Message::Message(&local_208);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                     ,0xa0,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__3.message_,&local_208);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_208);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_248,"value = -100",&local_249);
        local_221 = anon_unknown.dwarf_38f65::P::parseInt
                              ((P *)&v64,&local_248,(int64_t *)&gtest_ar_.message_);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_220,&local_221,(type *)0x0);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
        if (!bVar1) {
          testing::Message::Message(&local_258);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_3.message_,(internal *)local_220,
                     (AssertionResult *)"parser.parseInt(\"value = -100\", v64)","false","true",
                     in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_260,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                     ,0xa1,pcVar2);
          testing::internal::AssertHelper::operator=(&local_260,&local_258);
          testing::internal::AssertHelper::~AssertHelper(&local_260);
          std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_258);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_294 = -100;
          testing::internal::EqHelper::Compare<int,_long,_nullptr>
                    ((EqHelper *)local_290,"-100","v64",&local_294,(long *)&gtest_ar_.message_);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
          if (!bVar1) {
            testing::Message::Message(&local_2a0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                       ,0xa2,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__4.message_,&local_2a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_2a0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2e0,"value = 0x1a",&local_2e1);
          local_2b9 = anon_unknown.dwarf_38f65::P::parseInt
                                ((P *)&v64,&local_2e0,(int64_t *)&gtest_ar_.message_);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
          if (!bVar1) {
            testing::Message::Message(&local_2f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_4.message_,(internal *)local_2b8,
                       (AssertionResult *)"parser.parseInt(\"value = 0x1a\", v64)","false","true",
                       in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                       ,0xa3,pcVar2);
            testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
            testing::internal::AssertHelper::~AssertHelper(&local_2f8);
            std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_2f0);
          }
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_32c = 0x1a;
            testing::internal::EqHelper::Compare<int,_long,_nullptr>
                      ((EqHelper *)local_328,"26","v64",&local_32c,(long *)&gtest_ar_.message_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
            if (!bVar1) {
              testing::Message::Message(&local_338);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                         ,0xa4,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__5.message_,&local_338);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_338);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_378,"value = 0x1F",&local_379);
            local_351 = anon_unknown.dwarf_38f65::P::parseInt
                                  ((P *)&v64,&local_378,(int64_t *)&gtest_ar_.message_);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_350,&local_351,(type *)0x0);
            std::__cxx11::string::~string((string *)&local_378);
            std::allocator<char>::~allocator((allocator<char> *)&local_379);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
            if (!bVar1) {
              testing::Message::Message(&local_388);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_5.message_,(internal *)local_350,
                         (AssertionResult *)"parser.parseInt(\"value = 0x1F\", v64)","false","true",
                         in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_390,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                         ,0xa5,pcVar2);
              testing::internal::AssertHelper::operator=(&local_390,&local_388);
              testing::internal::AssertHelper::~AssertHelper(&local_390);
              std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
              testing::Message::~Message(&local_388);
            }
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
            if (gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_3c4 = 0x1f;
              testing::internal::EqHelper::Compare<int,_long,_nullptr>
                        ((EqHelper *)local_3c0,"31","v64",&local_3c4,(long *)&gtest_ar_.message_);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
              if (!bVar1) {
                testing::Message::Message(&local_3d0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                           ,0xa6,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__6.message_,&local_3d0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__6.message_);
                testing::Message::~Message(&local_3d0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_410,"value = 0x0",&local_411);
              local_3e9 = anon_unknown.dwarf_38f65::P::parseInt
                                    ((P *)&v64,&local_410,(int64_t *)&gtest_ar_.message_);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_3e8,&local_3e9,(type *)0x0);
              std::__cxx11::string::~string((string *)&local_410);
              std::allocator<char>::~allocator((allocator<char> *)&local_411);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
              if (!bVar1) {
                testing::Message::Message(&local_420);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_6.message_,(internal *)local_3e8,
                           (AssertionResult *)"parser.parseInt(\"value = 0x0\", v64)","false","true"
                           ,in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_428,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                           ,0xa7,pcVar2);
                testing::internal::AssertHelper::operator=(&local_428,&local_420);
                testing::internal::AssertHelper::~AssertHelper(&local_428);
                std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
                testing::Message::~Message(&local_420);
              }
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
              if (gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_45c = 0;
                testing::internal::EqHelper::Compare<int,_long,_nullptr>
                          ((EqHelper *)local_458,"0","v64",&local_45c,(long *)&gtest_ar_.message_);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_458);
                if (!bVar1) {
                  testing::Message::Message(&local_468);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                             ,0xa8,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__7.message_,&local_468);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__7.message_);
                  testing::Message::~Message(&local_468);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_4a8,"value = 100.123",&local_4a9);
                bVar1 = anon_unknown.dwarf_38f65::P::parseInt
                                  ((P *)&v64,&local_4a8,(int64_t *)&gtest_ar_.message_);
                local_481 = (bool)(~bVar1 & 1);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_480,&local_481,(type *)0x0);
                std::__cxx11::string::~string((string *)&local_4a8);
                std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_480);
                if (!bVar1) {
                  testing::Message::Message(&local_4b8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_480,
                             (AssertionResult *)"parser.parseInt(\"value = 100.123\", v64)","true",
                             "false",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_4c0,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                             ,0xa9,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
                  testing::internal::AssertHelper::~AssertHelper(&local_4c0);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_4b8);
                }
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
                if (gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_518,"value = \'100\'",&local_519);
                  local_4f1 = anon_unknown.dwarf_38f65::P::parseInt
                                        ((P *)&v64,&local_518,(int64_t *)&gtest_ar_.message_);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_4f0,&local_4f1,(type *)0x0);
                  std::__cxx11::string::~string((string *)&local_518);
                  std::allocator<char>::~allocator((allocator<char> *)&local_519);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_4f0);
                  if (!bVar1) {
                    testing::Message::Message(&local_528);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar_7.message_,(internal *)local_4f0,
                               (AssertionResult *)"parser.parseInt(\"value = \'100\'\", v64)",
                               "false","true",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_530,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                               ,0xaa,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_530,&local_528);
                    testing::internal::AssertHelper::~AssertHelper(&local_530);
                    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
                    testing::Message::~Message(&local_528);
                  }
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
                  if (gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    local_564 = 100;
                    testing::internal::EqHelper::Compare<int,_long,_nullptr>
                              ((EqHelper *)local_560,"100","v64",&local_564,
                               (long *)&gtest_ar_.message_);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_560);
                    if (!bVar1) {
                      testing::Message::Message(&local_570);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_560);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_578,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
                                 ,0xab,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_578,&local_570);
                      testing::internal::AssertHelper::~AssertHelper(&local_578);
                      testing::Message::~Message(&local_570);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  anon_unknown.dwarf_38f65::P::~P((P *)&v64);
  return;
}

Assistant:

TEST(ParserTest, ParsesIntegers) {
  P parser;
  int64_t v64 = 0;
  ASSERT_TRUE(parser.parseInt("value = 100", v64));
  EXPECT_EQ(100, v64);
  ASSERT_TRUE(parser.parseInt("value = 0", v64));
  EXPECT_EQ(0, v64);
  ASSERT_TRUE(parser.parseInt("value = -0", v64));
  EXPECT_EQ(0, v64);
  ASSERT_TRUE(parser.parseInt("value = -100", v64));
  EXPECT_EQ(-100, v64);
  ASSERT_TRUE(parser.parseInt("value = 0x1a", v64));
  EXPECT_EQ(26, v64);
  ASSERT_TRUE(parser.parseInt("value = 0x1F", v64));
  EXPECT_EQ(31, v64);
  ASSERT_TRUE(parser.parseInt("value = 0x0", v64));
  EXPECT_EQ(0, v64);
  ASSERT_FALSE(parser.parseInt("value = 100.123", v64));
  ASSERT_TRUE(parser.parseInt("value = '100'", v64));
  EXPECT_EQ(100, v64);
}